

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorProto::Clear(DescriptorProto *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  LogMessageFatal local_30 [19];
  Voidify local_1d;
  uint local_1c;
  DescriptorProto *pDStack_18;
  uint32_t cached_has_bits;
  DescriptorProto *this_local;
  
  this_local = (DescriptorProto *)&this->field_0;
  local_1c = 0;
  pDStack_18 = this;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear(&(this->field_0)._impl_.field_);
  RepeatedPtrField<google::protobuf::DescriptorProto>::Clear(&(this->field_0)._impl_.nested_type_);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Clear(&(this->field_0)._impl_.enum_type_)
  ;
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Clear
            (&(this->field_0)._impl_.extension_range_);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Clear
            (&(this->field_0)._impl_.extension_);
  RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Clear
            (&(this->field_0)._impl_.oneof_decl_);
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Clear
            (&(this->field_0)._impl_.reserved_range_);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.reserved_name_);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 3) != 0) {
    if ((local_1c & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.name_);
    }
    if ((local_1c & 2) != 0) {
      if ((this->field_0)._impl_.options_ == (MessageOptions *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_40,"_impl_.options_ != nullptr");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
                   ,0x1140,local_40._M_len,local_40._M_str);
        pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_30);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_1d,pLVar2);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
      }
      MessageOptions::Clear((this->field_0)._impl_.options_);
    }
  }
  internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void DescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.DescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.field_.Clear();
  _impl_.nested_type_.Clear();
  _impl_.enum_type_.Clear();
  _impl_.extension_range_.Clear();
  _impl_.extension_.Clear();
  _impl_.oneof_decl_.Clear();
  _impl_.reserved_range_.Clear();
  _impl_.reserved_name_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}